

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall
wasm::Wasm2JSBuilder::addFunctionImport(Wasm2JSBuilder *this,Ref ast,Function *import)

{
  char *pcVar1;
  Ref r;
  Ref RVar2;
  Ref in_R8;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  IString IVar21;
  IString name;
  
  pcVar1 = (import->super_Importable).base.super_IString.str._M_str;
  iVar9 = (int)pcVar1;
  iVar10 = (int)((ulong)pcVar1 >> 0x20);
  auVar15._0_4_ = -(uint)((int)_Init == iVar9);
  auVar15._4_4_ = -(uint)((int)((ulong)_Init >> 0x20) == iVar10);
  auVar15._8_4_ = -(uint)((int)__M_construct == iVar9);
  auVar15._12_4_ = -(uint)((int)((ulong)__M_construct >> 0x20) == iVar10);
  auVar20._4_4_ = auVar15._0_4_;
  auVar20._0_4_ = auVar15._4_4_;
  auVar20._8_4_ = auVar15._12_4_;
  auVar20._12_4_ = auVar15._8_4_;
  auVar18._0_4_ = -(uint)((int)cashew::MINUS == iVar9);
  auVar18._4_4_ = -(uint)((int)((ulong)cashew::MINUS >> 0x20) == iVar10);
  auVar18._8_4_ = -(uint)((int)_dump == iVar9);
  auVar18._12_4_ = -(uint)((int)((ulong)_dump >> 0x20) == iVar10);
  auVar16._4_4_ = auVar18._0_4_;
  auVar16._0_4_ = auVar18._4_4_;
  auVar16._8_4_ = auVar18._12_4_;
  auVar16._12_4_ = auVar18._8_4_;
  auVar17 = packssdw(auVar16 & auVar18,auVar20 & auVar15);
  auVar11._0_4_ = -(uint)((int)_getStruct == iVar9);
  auVar11._4_4_ = -(uint)((int)((ulong)_getStruct >> 0x20) == iVar10);
  auVar11._8_4_ = -(uint)((int)cashew::CALL == iVar9);
  auVar11._12_4_ = -(uint)((int)((ulong)cashew::CALL >> 0x20) == iVar10);
  auVar19._4_4_ = auVar11._0_4_;
  auVar19._0_4_ = auVar11._4_4_;
  auVar19._8_4_ = auVar11._12_4_;
  auVar19._12_4_ = auVar11._8_4_;
  auVar14._0_4_ = -(uint)((int)cashew::TRSHIFT == iVar9);
  auVar14._4_4_ = -(uint)((int)((ulong)cashew::TRSHIFT >> 0x20) == iVar10);
  auVar14._8_4_ = -(uint)((int)cashew::SET == iVar9);
  auVar14._12_4_ = -(uint)((int)((ulong)cashew::SET >> 0x20) == iVar10);
  auVar12._4_4_ = auVar14._0_4_;
  auVar12._0_4_ = auVar14._4_4_;
  auVar12._8_4_ = auVar14._12_4_;
  auVar12._12_4_ = auVar14._8_4_;
  auVar13 = packssdw(auVar12 & auVar14,auVar19 & auVar11);
  auVar14 = packssdw(auVar13,auVar17);
  auVar5._0_4_ = -(uint)((int)ABI::wasm2js::TABLE_FILL == iVar9);
  auVar5._4_4_ = -(uint)((int)((ulong)ABI::wasm2js::TABLE_FILL >> 0x20) == iVar10);
  auVar5._8_4_ = -(uint)((int)_finalize == iVar9);
  auVar5._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar10);
  auVar8._4_4_ = auVar5._0_4_;
  auVar8._0_4_ = auVar5._4_4_;
  auVar8._8_4_ = auVar5._12_4_;
  auVar8._12_4_ = auVar5._8_4_;
  auVar7._0_4_ = -(uint)((int)cashew::OBJECT == iVar9);
  auVar7._4_4_ = -(uint)((int)((ulong)cashew::OBJECT >> 0x20) == iVar10);
  auVar7._8_4_ = -(uint)((int)UINT16ARRAY == iVar9);
  auVar7._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar10);
  auVar6._4_4_ = auVar7._0_4_;
  auVar6._0_4_ = auVar7._4_4_;
  auVar6._8_4_ = auVar7._12_4_;
  auVar6._12_4_ = auVar7._8_4_;
  auVar7 = packssdw(auVar6 & auVar7,auVar8 & auVar5);
  auVar17._0_4_ = -(uint)((int)__Unwind_Resume == iVar9);
  auVar17._4_4_ = -(uint)((int)((ulong)__Unwind_Resume >> 0x20) == iVar10);
  auVar17._8_4_ = -(uint)((int)std::cout == iVar9);
  auVar17._12_4_ = -(uint)((int)((ulong)std::cout >> 0x20) == iVar10);
  auVar4._4_4_ = auVar17._0_4_;
  auVar4._0_4_ = auVar17._4_4_;
  auVar4._8_4_ = auVar17._12_4_;
  auVar4._12_4_ = auVar17._8_4_;
  auVar13._0_4_ = -(uint)((int)_containsPass == iVar9);
  auVar13._4_4_ = -(uint)((int)((ulong)_containsPass >> 0x20) == iVar10);
  auVar13._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar9);
  auVar13._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar10);
  auVar3._4_4_ = auVar13._0_4_;
  auVar3._0_4_ = auVar13._4_4_;
  auVar3._8_4_ = auVar13._12_4_;
  auVar3._12_4_ = auVar13._8_4_;
  auVar13 = packssdw(auVar3 & auVar13,auVar4 & auVar17);
  auVar13 = packssdw(auVar13,auVar7);
  auVar13 = packsswb(auVar13,auVar14);
  if (((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar13 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar13 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar13 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar13 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar13 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar13 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar13 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar13 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar13 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar13 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar13 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar13 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar13[0xf]) &&
     (__M_create != pcVar1)) {
    ensureModuleVar(this,ast,&import->super_Importable);
    r = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,r);
    IVar21 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
    name.str._M_len = IVar21.str._M_str;
    RVar2 = getImportName(this,&import->super_Importable);
    name.str._M_str = (char *)RVar2.inst;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar21.str._M_len,name,in_R8);
    return;
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addFunctionImport(Ref ast, Function* import) {
  // The scratch memory helpers are emitted in the glue, see code and comments
  // below.
  if (ABI::wasm2js::isHelper(import->base)) {
    return;
  }
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), getImportName(*import));
}